

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_repeat_matcher.hpp
# Opt level: O0

bool __thiscall
boost::xpressive::detail::
simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::any_matcher>,mpl_::bool_<false>>
::
match_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
          (void *param_1,undefined8 *param_2,long *param_3)

{
  undefined8 uVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  uint matches;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  tmp;
  bool local_39;
  undefined4 in_stack_ffffffffffffffd0;
  uint uVar5;
  
  uVar1 = *param_2;
  for (uVar5 = 0;
      uVar5 < *(uint *)((long)&(((match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)param_1)->cur_)._M_current + 4); uVar5 = uVar5 + 1) {
    bVar2 = matcher_wrapper<boost::xpressive::detail::any_matcher>::
            match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                      ((matcher_wrapper<boost::xpressive::detail::any_matcher> *)
                       CONCAT44(uVar5,in_stack_ffffffffffffffd0),
                       (match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)param_1);
    if (!bVar2) {
      *param_2 = uVar1;
      return false;
    }
  }
  do {
    uVar4 = (**(code **)(*param_3 + 0x10))(param_3,param_2);
    if ((uVar4 & 1) != 0) {
      return true;
    }
    uVar3 = uVar5 + 1;
    local_39 = false;
    if (uVar5 < *(uint *)&((match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)param_1)->sub_matches_) {
      local_39 = matcher_wrapper<boost::xpressive::detail::any_matcher>::
                 match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                           ((matcher_wrapper<boost::xpressive::detail::any_matcher> *)
                            CONCAT44(uVar3,in_stack_ffffffffffffffd0),
                            (match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)param_1);
    }
    uVar5 = uVar3;
  } while (local_39 != false);
  *param_2 = uVar1;
  return false;
}

Assistant:

bool match_(match_state<BidiIter> &state, Next const &next, non_greedy_tag) const
        {
            BOOST_ASSERT(!this->leading_);
            BidiIter const tmp = state.cur_;
            unsigned int matches = 0;

            for(; matches < this->min_; ++matches)
            {
                if(!this->xpr_.match(state))
                {
                    state.cur_ = tmp;
                    return false;
                }
            }

            do
            {
                if(next.match(state))
                {
                    return true;
                }
            }
            while(matches++ < this->max_ && this->xpr_.match(state));

            state.cur_ = tmp;
            return false;
        }